

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall
doctest::anon_unknown_14::JUnitReporter::test_run_end(JUnitReporter *this,TestRunStats *p)

{
  XmlWriter *this_00;
  ContextOptions *pCVar1;
  pointer pJVar2;
  char *__s;
  size_t sVar3;
  pointer attribute;
  String *file;
  pointer pJVar4;
  tm timeInfo;
  ScopedElement scoped_1;
  char timeStamp [21];
  time_t rawtime;
  string binary_name;
  undefined1 local_120 [56];
  string local_e8;
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  pointer local_88;
  pointer local_80;
  JUnitReporter *local_78;
  string local_70;
  string local_50;
  
  pCVar1 = this->opt;
  if ((pCVar1->binary_name).field_0.buf[0x17] < '\0') {
    file = (String *)(pCVar1->binary_name).field_0.data.ptr;
  }
  else {
    file = &pCVar1->binary_name;
  }
  __s = skipPathFromFilename((char *)file);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,__s,(allocator<char> *)local_120);
  local_120._0_8_ = local_120 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"testsuites","");
  this_00 = &this->xml;
  XmlWriter::startElement(this_00,(string *)local_120);
  if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
    operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
  }
  local_120._0_8_ = local_120 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"testsuite","");
  XmlWriter::startElement(this_00,(string *)local_120);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"name","");
  XmlWriter::writeAttribute(this_00,&local_e8,&local_50);
  local_c8._0_8_ = local_c8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"errors","");
  XmlWriter::writeAttribute<int>(this_00,(string *)local_c8,&(this->testCaseData).totalErrors);
  local_a8._0_8_ = (XmlWriter *)(local_a8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"failures","");
  XmlWriter::writeAttribute<int>(this_00,(string *)local_a8,&(this->testCaseData).totalFailures);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"tests","");
  XmlWriter::writeAttribute<int>(this_00,&local_70,&p->numAsserts);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._0_8_ + 1);
  }
  if ((XmlWriter *)local_a8._0_8_ != (XmlWriter *)(local_a8 + 0x10)) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  if ((XmlWriter *)local_c8._0_8_ != (XmlWriter *)(local_c8 + 0x10)) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
    operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
  }
  if (this->opt->no_time_in_output == false) {
    local_120._0_8_ = local_120 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"time","");
    XmlWriter::writeAttribute<double>
              (this_00,(string *)local_120,&(this->testCaseData).totalSeconds);
    if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
      operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
    }
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"timestamp","");
    time((time_t *)&local_70);
    gmtime_r((time_t *)&local_70,(tm *)local_120);
    strftime(local_a8,0x15,"%Y-%m-%dT%H:%M:%SZ",(tm *)local_120);
    local_c8._0_8_ = local_c8 + 0x10;
    sVar3 = strlen(local_a8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,local_a8,local_a8 + sVar3);
    XmlWriter::writeAttribute(this_00,&local_e8,(string *)local_c8);
    if ((XmlWriter *)local_c8._0_8_ != (XmlWriter *)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->opt->no_version == false) {
    local_120._0_8_ = local_120 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"doctest_version","");
    XmlWriter::writeAttribute(this_00,(string *)local_120,"2.4.6");
    if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
      operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
    }
  }
  attribute = (this->testCaseData).testcases.
              super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_80 = (this->testCaseData).testcases.
             super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_78 = this;
  if (attribute != local_80) {
    do {
      local_120._0_8_ = local_120 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"testcase","");
      XmlWriter::startElement(this_00,(string *)local_120);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"classname","");
      XmlWriter::writeAttribute(this_00,&local_e8,&attribute->classname);
      local_c8._0_8_ = local_c8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"name","");
      XmlWriter::writeAttribute(this_00,(string *)local_c8,&attribute->name);
      if ((XmlWriter *)local_c8._0_8_ != (XmlWriter *)(local_c8 + 0x10)) {
        operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
        operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
      }
      if (local_78->opt->no_time_in_output == false) {
        local_120._0_8_ = local_120 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"time","");
        XmlWriter::writeAttribute<double>(this_00,(string *)local_120,&attribute->time);
        if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
          operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
        }
      }
      local_120._0_8_ = local_120 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"status","");
      XmlWriter::writeAttribute(this_00,(string *)local_120,"run");
      if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
        operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
      }
      pJVar2 = (attribute->failures).
               super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_88 = attribute;
      for (pJVar4 = (attribute->failures).
                    super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                    ._M_impl.super__Vector_impl_data._M_start; pJVar4 != pJVar2; pJVar4 = pJVar4 + 1
          ) {
        local_120._0_8_ = local_120 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"failure","");
        local_a8._0_8_ = this_00;
        XmlWriter::startElement(this_00,(string *)local_120);
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"message","");
        XmlWriter::writeAttribute((XmlWriter *)local_a8._0_8_,&local_e8,&pJVar4->message);
        local_c8._0_8_ = local_c8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"type","");
        XmlWriter::writeAttribute((XmlWriter *)local_a8._0_8_,(string *)local_c8,&pJVar4->type);
        XmlWriter::ScopedElement::writeText((ScopedElement *)local_a8,&pJVar4->details,false);
        if ((XmlWriter *)local_c8._0_8_ != (XmlWriter *)(local_c8 + 0x10)) {
          operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_a8);
        if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
          operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
        }
      }
      pJVar2 = (local_88->errors).
               super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pJVar4 = (local_88->errors).
                    super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                    ._M_impl.super__Vector_impl_data._M_start; pJVar4 != pJVar2; pJVar4 = pJVar4 + 1
          ) {
        local_120._0_8_ = local_120 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"error","");
        local_c8._0_8_ = this_00;
        XmlWriter::startElement(this_00,(string *)local_120);
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"message","");
        XmlWriter::writeAttribute((XmlWriter *)local_c8._0_8_,&local_e8,&pJVar4->message);
        XmlWriter::ScopedElement::writeText((ScopedElement *)local_c8,&pJVar4->details,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_c8);
        if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
          operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
        }
      }
      XmlWriter::endElement(this_00);
      attribute = local_88 + 1;
    } while (attribute != local_80);
  }
  XmlWriter::endElement(this_00);
  XmlWriter::endElement(this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void test_run_end(const TestRunStats& p) override {
            // remove .exe extension - mainly to have the same output on UNIX and Windows
            std::string binary_name = skipPathFromFilename(opt.binary_name.c_str());
#ifdef DOCTEST_PLATFORM_WINDOWS
            if(binary_name.rfind(".exe") != std::string::npos)
                binary_name = binary_name.substr(0, binary_name.length() - 4);
#endif // DOCTEST_PLATFORM_WINDOWS
            xml.startElement("testsuites");
            xml.startElement("testsuite").writeAttribute("name", binary_name)
                    .writeAttribute("errors", testCaseData.totalErrors)
                    .writeAttribute("failures", testCaseData.totalFailures)
                    .writeAttribute("tests", p.numAsserts);
            if(opt.no_time_in_output == false) {
                xml.writeAttribute("time", testCaseData.totalSeconds);
                xml.writeAttribute("timestamp", JUnitTestCaseData::getCurrentTimestamp());
            }
            if(opt.no_version == false)
                xml.writeAttribute("doctest_version", DOCTEST_VERSION_STR);

            for(const auto& testCase : testCaseData.testcases) {
                xml.startElement("testcase")
                    .writeAttribute("classname", testCase.classname)
                    .writeAttribute("name", testCase.name);
                if(opt.no_time_in_output == false)
                    xml.writeAttribute("time", testCase.time);
                // This is not ideal, but it should be enough to mimic gtest's junit output.
                xml.writeAttribute("status", "run");

                for(const auto& failure : testCase.failures) {
                    xml.scopedElement("failure")
                        .writeAttribute("message", failure.message)
                        .writeAttribute("type", failure.type)
                        .writeText(failure.details, false);
                }

                for(const auto& error : testCase.errors) {
                    xml.scopedElement("error")
                        .writeAttribute("message", error.message)
                        .writeText(error.details);
                }

                xml.endElement();
            }
            xml.endElement();
            xml.endElement();
        }